

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3ExprCodeExprList(Parse *pParse,ExprList *pList,int target,int srcReg,u8 flags)

{
  ushort uVar1;
  Vdbe *p;
  Expr *pExpr;
  uint op;
  int p1;
  Op *pOVar2;
  int iVar3;
  int iVar4;
  int target_00;
  byte bVar5;
  int iVar6;
  ExprList_item *pEVar7;
  Walker local_68;
  
  iVar4 = pList->nExpr;
  if (0 < iVar4) {
    p = pParse->pVdbe;
    bVar5 = flags & 0x7d;
    if (pParse->okConstFactor != '\0') {
      bVar5 = flags;
    }
    pEVar7 = pList->a;
    op = (uint)(flags & 1 ^ 0x55);
    iVar6 = 0;
    do {
      pExpr = pEVar7->pExpr;
      if (((bVar5 & 4) == 0) || (uVar1 = (pEVar7->u).x.iOrderByCol, uVar1 == 0)) {
        if ((bVar5 & 2) == 0) {
LAB_00154e64:
          target_00 = target + iVar6;
          p1 = sqlite3ExprCodeTarget(pParse,pExpr,target_00);
          if (p1 != target_00) {
            if ((flags & 1) != 0) {
              pOVar2 = (Op *)&sqlite3VdbeGetOp_dummy;
              if (p->db->mallocFailed == '\0') {
                pOVar2 = p->aOp + (long)p->nOp + -1;
              }
              if (((pOVar2->opcode == 'T') && (iVar3 = pOVar2->p3 + 1, pOVar2->p1 + iVar3 == p1)) &&
                 (pOVar2->p2 + iVar3 == target_00)) {
                pOVar2->p3 = iVar3;
                goto LAB_00154f62;
              }
            }
            sqlite3VdbeAddOp3(p,op,p1,target_00,0);
          }
        }
        else {
          local_68.u.pNC = (NameContext *)0x0;
          local_68.pParse = (Parse *)0x0;
          local_68.xSelectCallback2 = (_func_void_Walker_ptr_Select_ptr *)0x0;
          local_68.walkerDepth = 0;
          local_68.eCode = '\x01';
          local_68._37_3_ = 0;
          local_68.xExprCallback = exprNodeIsConstant;
          local_68.xSelectCallback = selectNodeIsConstant;
          if (pExpr != (Expr *)0x0) {
            walkExpr(&local_68,pExpr);
            if (local_68.eCode == '\0') goto LAB_00154e64;
          }
          sqlite3ExprCodeAtInit(pParse,pExpr,iVar6 + target);
        }
      }
      else if ((bVar5 & 8) == 0) {
        sqlite3VdbeAddOp3(p,op,(uint)uVar1 + srcReg + -1,iVar6 + target,0);
      }
      else {
        iVar6 = iVar6 + -1;
        iVar4 = iVar4 + -1;
      }
LAB_00154f62:
      iVar6 = iVar6 + 1;
      pEVar7 = pEVar7 + 1;
    } while (iVar6 < iVar4);
  }
  return iVar4;
}

Assistant:

SQLITE_PRIVATE int sqlite3ExprCodeExprList(
  Parse *pParse,     /* Parsing context */
  ExprList *pList,   /* The expression list to be coded */
  int target,        /* Where to write results */
  int srcReg,        /* Source registers if SQLITE_ECEL_REF */
  u8 flags           /* SQLITE_ECEL_* flags */
){
  struct ExprList_item *pItem;
  int i, j, n;
  u8 copyOp = (flags & SQLITE_ECEL_DUP) ? OP_Copy : OP_SCopy;
  Vdbe *v = pParse->pVdbe;
  assert( pList!=0 );
  assert( target>0 );
  assert( pParse->pVdbe!=0 );  /* Never gets this far otherwise */
  n = pList->nExpr;
  if( !ConstFactorOk(pParse) ) flags &= ~SQLITE_ECEL_FACTOR;
  for(pItem=pList->a, i=0; i<n; i++, pItem++){
    Expr *pExpr = pItem->pExpr;
    if( (flags & SQLITE_ECEL_REF)!=0 && (j = pItem->u.x.iOrderByCol)>0 ){
      if( flags & SQLITE_ECEL_OMITREF ){
        i--;
        n--;
      }else{
        sqlite3VdbeAddOp2(v, copyOp, j+srcReg-1, target+i);
      }
    }else if( (flags & SQLITE_ECEL_FACTOR)!=0 && sqlite3ExprIsConstant(pExpr) ){
      sqlite3ExprCodeAtInit(pParse, pExpr, target+i);
    }else{
      int inReg = sqlite3ExprCodeTarget(pParse, pExpr, target+i);
      if( inReg!=target+i ){
        VdbeOp *pOp;
        if( copyOp==OP_Copy
         && (pOp=sqlite3VdbeGetOp(v, -1))->opcode==OP_Copy
         && pOp->p1+pOp->p3+1==inReg
         && pOp->p2+pOp->p3+1==target+i
        ){
          pOp->p3++;
        }else{
          sqlite3VdbeAddOp2(v, copyOp, inReg, target+i);
        }
      }
    }
  }
  return n;
}